

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O0

aom_codec_err_t
validate_config(aom_codec_alg_priv_t_conflict *ctx,aom_codec_enc_cfg_t *cfg,av1_extracfg *extra_cfg)

{
  AV1_LEVEL seq_level_idx;
  undefined1 auVar1 [12];
  int iVar2;
  int *in_RDX;
  uint *in_RSI;
  undefined8 *in_RDI;
  int level_idx;
  int i;
  FIRSTPASS_STATS *stats;
  int n_packets;
  size_t packet_sz;
  int64_t max_frame_area;
  uint max_frame_height;
  uint max_frame_width;
  uint local_60;
  uint local_58;
  uint local_54;
  int local_4c;
  
  if ((in_RSI[3] == 0) || (0x10000 < in_RSI[3])) {
    *in_RDI = "g_w out of range [1..65536]";
  }
  else if ((in_RSI[4] == 0) || (0x10000 < in_RSI[4])) {
    *in_RDI = "g_h out of range [1..65536]";
  }
  else if (in_RSI[6] < 0x10001) {
    if (in_RSI[7] < 0x10001) {
      if ((in_RSI[6] == 0) || (in_RSI[3] <= in_RSI[6])) {
        if ((in_RSI[7] == 0) || (in_RSI[4] <= in_RSI[7])) {
          if (in_RSI[6] == 0) {
            local_54 = in_RSI[3];
          }
          else {
            local_54 = in_RSI[6];
          }
          if (in_RSI[7] == 0) {
            local_58 = in_RSI[4];
          }
          else {
            local_58 = in_RSI[7];
          }
          if ((long)((ulong)local_54 * (ulong)local_58) < 0x40000001) {
            if (((int)in_RSI[0xb] < 1) || (1000000000 < (int)in_RSI[0xb])) {
              *in_RDI = "g_timebase.den out of range [1..1000000000]";
            }
            else if (((int)in_RSI[10] < 1) || (1000000000 < (int)in_RSI[10])) {
              *in_RDI = "g_timebase.num out of range [1..1000000000]";
            }
            else if (in_RSI[2] < 3) {
              if (in_RSI[0x22] < 0x1e8481) {
                if (in_RSI[0x24] < 0x40) {
                  if (in_RSI[0x24] < in_RSI[0x23]) {
                    *in_RDI = "rc_min_quantizer out of range [..cfg->rc_max_quantizer]";
                  }
                  else if ((uint)(in_RDX[0x21] != 0) == in_RDX[0x21]) {
                    if (*(byte *)(in_RDX + 0x33) < 4) {
                      if (*(byte *)((long)in_RDX + 0xcd) < 7) {
                        if ((*in_RSI == 2) || (*(char *)((long)in_RDX + 0xcd) != '\x06')) {
                          if (in_RDX[0x35] < 2) {
                            if ((uint)in_RDX[0x36] < 2) {
                              if (*in_RSI < 3) {
                                if (in_RSI[1] < 0x41) {
                                  if (in_RSI[0x18] < 4) {
                                    if (in_RSI[0x25] < 0x65) {
                                      if (in_RSI[0x26] < 0x65) {
                                        if (in_RSI[0x2a] < 0x65) {
                                          if (in_RSI[0x2e] < 2) {
                                            if (in_RSI[0xf] < 0x65) {
                                              if (in_RSI[0xd] < 4) {
                                                if (in_RSI[0xe] < 0x31) {
                                                  if (*in_RSI == 2) {
                                                    if (in_RSI[0xe] != 0) {
                                                      *in_RDI = "g_lag_in_frames out of range [..0]"
                                                      ;
                                                      return AOM_CODEC_INVALID_PARAM;
                                                    }
                                                    if (in_RSI[0x30] != 0) {
                                                      *in_RDI = "kf_max_dist out of range [..0]";
                                                      return AOM_CODEC_INVALID_PARAM;
                                                    }
                                                  }
                                                  if ((uint)in_RDX[0xf] < 0x30) {
                                                    if ((uint)in_RDX[0x10] < 0x30) {
                                                      if (in_RDX[0x10] != 0) {
                                                        if ((uint)in_RDX[0xf] < 2) {
                                                          local_60 = 2;
                                                        }
                                                        else {
                                                          local_60 = in_RDX[0xf];
                                                        }
                                                        if (((uint)in_RDX[0x10] < local_60) ||
                                                           (0x2f < (uint)in_RDX[0x10])) {
                                                          *in_RDI = 
                                                  "max_gf_interval out of range [AOMMAX(2, extra_cfg->min_gf_interval)..(MAX_LAG_BUFFERS - 1)]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  if ((uint)in_RDX[0x11] < 6) {
                                                    if ((uint)in_RDX[0x12] < 6) {
                                                      if ((uint)in_RDX[0x12] < (uint)in_RDX[0x11]) {
                                                        *in_RDI = 
                                                  "gf_min_pyr_height must be less than or equal to gf_max_pyramid_height"
                                                  ;
                                                  }
                                                  else if (in_RSI[0x10] < 4) {
                                                    if ((in_RSI[0x11] < 8) || (0x10 < in_RSI[0x11]))
                                                    {
                                                      *in_RDI = 
                                                  "rc_resize_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  else if ((in_RSI[0x12] < 8) ||
                                                          (0x10 < in_RSI[0x12])) {
                                                    *in_RDI = 
                                                  "rc_resize_kf_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  else if (in_RSI[0x13] < 5) {
                                                    if ((in_RSI[0x14] < 8) || (0x10 < in_RSI[0x14]))
                                                    {
                                                      *in_RDI = 
                                                  "rc_superres_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  else if ((in_RSI[0x15] < 8) ||
                                                          (0x10 < in_RSI[0x15])) {
                                                    *in_RDI = 
                                                  "rc_superres_kf_denominator out of range [SCALE_NUMERATOR..SCALE_NUMERATOR << 1]"
                                                  ;
                                                  }
                                                  else if ((in_RSI[0x16] == 0) ||
                                                          (0x3f < in_RSI[0x16])) {
                                                    *in_RDI = 
                                                  "rc_superres_qthresh out of range [1..63]";
                                                  }
                                                  else if ((in_RSI[0x17] == 0) ||
                                                          (0x3f < in_RSI[0x17])) {
                                                    *in_RDI = 
                                                  "rc_superres_kf_qthresh out of range [1..63]";
                                                  }
                                                  else if ((uint)in_RDX[0x47] < 3) {
                                                    if ((uint)in_RDX[0x46] < 3) {
                                                      if ((uint)in_RDX[0x88] < 2) {
                                                        if ((uint)in_RDX[0x87] < 2) {
                                                          if ((uint)in_RDX[1] < 2) {
                                                            if ((uint)in_RDX[2] < 3) {
                                                              if (-1 < *in_RDX) {
                                                                iVar2 = 9;
                                                                if (*in_RSI == 1) {
                                                                  iVar2 = 0xc;
                                                                }
                                                                if (*in_RDX <= iVar2) {
                                                                  if (6 < (uint)in_RDX[3]) {
                                                                    *in_RDI = 
                                                  "noise_sensitivity out of range [..6]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (2 < (uint)in_RDX[0x3f]) {
                                                    *in_RDI = 
                                                  "superblock_size out of range [AOM_SUPERBLOCK_SIZE_64X64..AOM_SUPERBLOCK_SIZE_DYNAMIC]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < in_RSI[0x33]) {
                                                    *in_RDI = "large_scale_tile out of range [..1]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[0x40]) {
                                                    *in_RDI = 
                                                  "single_tile_decoding out of range [..1]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[0x18]) {
                                                    *in_RDI = 
                                                  "enable_rate_guide_deltaq out of range [..1]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[6]) {
                                                    *in_RDI = "row_mt out of range [..1]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[7]) {
                                                    *in_RDI = "fp_mt out of range [..1]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (6 < (uint)in_RDX[8]) {
                                                    *in_RDI = "tile_columns out of range [..6]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (6 < (uint)in_RDX[9]) {
                                                    *in_RDI = "tile_rows out of range [..6]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[10]) {
                                                    *in_RDI = "auto_tiles out of range [..1]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < in_RSI[0x34]) {
                                                    *in_RDI = "monochrome out of range [..1]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[0x33] != 0) &&
                                                     ((char)in_RDX[0x33] != '\0')) {
                                                    *in_RDI = 
                                                  "Adaptive quantization are not supported in large scale tile coding."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (7 < (uint)in_RDX[4]) {
                                                    *in_RDI = "sharpness out of range [..7]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (0xf < (uint)in_RDX[0xd]) {
                                                    *in_RDI = "arnr_max_frames out of range [..15]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (6 < (uint)in_RDX[0xe]) {
                                                    *in_RDI = "arnr_strength out of range [..6]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (0x3f < (uint)in_RDX[0x1d]) {
                                                    *in_RDI = "cq_level out of range [..63]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[8] < 8) || (0xc < in_RSI[8])) {
                                                    *in_RDI = 
                                                  "g_bit_depth out of range [AOM_BITS_8..AOM_BITS_12]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[9] < 8) || (0xc < in_RSI[9])) {
                                                    *in_RDI = 
                                                  "g_input_bit_depth out of range [8..12]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (2 < (uint)in_RDX[0x37]) {
                                                    *in_RDI = 
                                                  "content out of range [AOM_CONTENT_DEFAULT..AOM_CONTENT_INVALID - 1]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < in_RSI[0xd]) {
                                                    auVar1._8_4_ = 0;
                                                    auVar1._0_8_ = *(ulong *)(in_RSI + 0x1c);
                                                    iVar2 = SUB124(auVar1 / ZEXT812(0xe8),0);
                                                    if (*(long *)(in_RSI + 0x1a) == 0) {
                                                      *in_RDI = "rc_twopass_stats_in.buf not set.";
                                                      return AOM_CODEC_INVALID_PARAM;
                                                    }
                                                    if (*(ulong *)(in_RSI + 0x1c) % 0xe8 != 0) {
                                                      *in_RDI = 
                                                  "rc_twopass_stats_in.sz indicates truncated packet."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (*(ulong *)(in_RSI + 0x1c) < 0x1d0) {
                                                    *in_RDI = 
                                                  "rc_twopass_stats_in requires at least two packets."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((int)(*(double *)
                                                             (*(long *)(in_RSI + 0x1a) +
                                                              (long)iVar2 * 0xe8 + -0x38) + 0.5) !=
                                                      iVar2 + -1) {
                                                    *in_RDI = 
                                                  "rc_twopass_stats_in missing EOS stats packet";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  if (((in_RDX[0x89] != -1) && (in_RSI[0xd] == 0))
                                                     && (in_RDX[0x89] != 1)) {
                                                    *in_RDI = "One pass encoding but passes != 1.";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x89] != -1) &&
                                                     (in_RDX[0x89] < (int)in_RSI[0xd])) {
                                                    *in_RDI = 
                                                  "Current pass is larger than total number of passes."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[2] == 1) && (in_RSI[0x34] != 0)) {
                                                    *in_RDI = 
                                                  "Monochrome is not supported in profile 1";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[2] < 2) && (10 < in_RSI[8])) {
                                                    *in_RDI = 
                                                  "Codec bit-depth 12 not supported in profile < 2";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[2] < 2) && (10 < in_RSI[9])) {
                                                    *in_RDI = 
                                                  "Source bit-depth 12 not supported in profile < 2"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (in_RSI[0x18] == 3) {
                                                    if (1 < in_RSI[0xb9]) {
                                                      *in_RDI = 
                                                  "use_fixed_qp_offsets out of range [..1]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  else if (in_RSI[0xb9] != 0) {
                                                    *in_RDI = 
                                                  "--use_fixed_qp_offsets can only be used with --end-usage=q"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x38] == 0) ||
                                                     (0x16 < (uint)in_RDX[0x38])) {
                                                    *in_RDI = 
                                                  "color_primaries out of range [AOM_CICP_CP_BT_709..AOM_CICP_CP_EBU_3213]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x39] == 0) ||
                                                     (0x12 < (uint)in_RDX[0x39])) {
                                                    *in_RDI = 
                                                  "transfer_characteristics out of range [AOM_CICP_TC_BT_709..AOM_CICP_TC_HLG]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (0xe < (uint)in_RDX[0x3a]) {
                                                    *in_RDI = 
                                                  "matrix_coefficients out of range [AOM_CICP_MC_IDENTITY..AOM_CICP_MC_ICTCP]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x3c] < 0) || (1 < in_RDX[0x3c])) {
                                                    *in_RDI = "color_range out of range [0..1]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RSI[0xd] == 0) && (in_RSI[0x18] == 0)) {
                                                    if (10000 < (uint)in_RDX[0x78]) {
                                                      *in_RDI = 
                                                  "vbr_corpus_complexity_lap out of range [..MAX_VBR_CORPUS_COMPLEXITY]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  else if (in_RDX[0x78] != 0) {
                                                    *in_RDI = 
                                                  "VBR corpus complexity is supported only in the case of single pass VBR mode."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (in_RDX[0x13] == 8) {
                                                    *in_RDI = 
                                                  "This error may be related to the wrong configuration options: try to set -DCONFIG_TUNE_BUTTERAUGLI=1 at the time CMake is run."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((3 < (uint)in_RDX[0x13]) &&
                                                     ((uint)in_RDX[0x13] < 8)) {
                                                    *in_RDI = 
                                                  "This error may be related to the wrong configuration options: try to set -DCONFIG_TUNE_VMAF=1 at the time CMake is run."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (0xb < (uint)in_RDX[0x13]) {
                                                    *in_RDI = 
                                                  "tuning out of range [AOM_TUNE_PSNR..AOM_TUNE_SSIMULACRA2]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[0x1c]) {
                                                    *in_RDI = 
                                                  "dist_metric out of range [AOM_DIST_METRIC_PSNR..AOM_DIST_METRIC_QM_PSNR]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (2 < (uint)in_RDX[0x2f]) {
                                                    *in_RDI = 
                                                  "timing_info_type out of range [AOM_TIMING_UNSPECIFIED..AOM_TIMING_DEC_MODEL]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x43] < 0) || (0x10 < in_RDX[0x43])) {
                                                    *in_RDI = 
                                                  "film_grain_test_vector out of range [0..16]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (in_RDX[0x21] != 0) {
                                                    if ((char)in_RDX[0x33] != '\0') {
                                                      *in_RDI = 
                                                  "Only --aq_mode=0 can be used with --lossless=1.";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (in_RDX[0x32] != 0) {
                                                    *in_RDI = 
                                                  "Only --enable_chroma_deltaq=0 can be used with --lossless=1."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  if ((in_RDX[0x53] < 3) || (7 < in_RDX[0x53])) {
                                                    *in_RDI = 
                                                  "max_reference_frames out of range [3..7]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((-1 < in_RDX[0x54]) && (in_RDX[0x54] < 2)) {
                                                    if (1 < (uint)in_RDX[0x6f]) {
                                                      *in_RDI = 
                                                  "enable_low_complexity_decode out of range [..1]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[0x70]) {
                                                    *in_RDI = 
                                                  "chroma_subsampling_x out of range [..1]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (1 < (uint)in_RDX[0x71]) {
                                                    *in_RDI = 
                                                  "chroma_subsampling_y out of range [..1]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x3a] == 0) &&
                                                     ((in_RDX[0x70] != 0 || (in_RDX[0x71] != 0)))) {
                                                    *in_RDI = 
                                                  "Subsampling must be 0 with AOM_CICP_MC_IDENTITY."
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x26]) {
                                                    *in_RDI = 
                                                  "disable_trellis_quant out of range [..3]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x83]) {
                                                    *in_RDI = 
                                                  "coeff_cost_upd_freq out of range [0..3]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x84]) {
                                                    *in_RDI = 
                                                  "mode_cost_upd_freq out of range [0..3]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x85]) {
                                                    *in_RDI = "mv_cost_upd_freq out of range [0..3]"
                                                    ;
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x86]) {
                                                    *in_RDI = "dv_cost_upd_freq out of range [0..3]"
                                                    ;
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x4b] < 4) || (0x80 < in_RDX[0x4b])) {
                                                    *in_RDI = 
                                                  "min_partition_size out of range [4..128]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x4c] < 4) || (0x80 < in_RDX[0x4c])) {
                                                    *in_RDI = 
                                                  "max_partition_size out of range [4..128]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (in_RDX[0x4c] < in_RDX[0x4b]) {
                                                    *in_RDI = 
                                                  "min_partition_size out of range [..extra_cfg->max_partition_size]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  for (local_4c = 0; local_4c < 0x20;
                                                      local_4c = local_4c + 1) {
                                                    seq_level_idx =
                                                         *(AV1_LEVEL *)
                                                          ((long)in_RDX + (long)local_4c + 0x1e4);
                                                    iVar2 = is_valid_seq_level_idx(seq_level_idx);
                                                    if ((iVar2 == 0) && (seq_level_idx != ' ')) {
                                                      *in_RDI = 
                                                  "Target sequence level index is invalid";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  if ((in_RDX[0x34] < 0) || (1000 < in_RDX[0x34])) {
                                                    *in_RDI = 
                                                  "deltaq_strength out of range [0..1000]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x8b]) {
                                                    *in_RDI = 
                                                  "loopfilter_control out of range [..3]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((uint)(in_RDX[0x8c] != 0) != in_RDX[0x8c]) {
                                                    *in_RDI = 
                                                  "skip_postproc_filtering expected boolean";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if (3 < (uint)in_RDX[0x22]) {
                                                    *in_RDI = "enable_cdef out of range [..3]";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((uint)(in_RDX[0x92] != 0) != in_RDX[0x92]) {
                                                    *in_RDI = 
                                                  "auto_intra_tools_off expected boolean";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((uint)(in_RDX[0x93] != 0) != in_RDX[0x93]) {
                                                    *in_RDI = 
                                                  "strict_level_conformance expected boolean";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((uint)(in_RDX[0x95] != 0) != in_RDX[0x95]) {
                                                    *in_RDI = "sb_qp_sweep expected boolean";
                                                    return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x94] < -1) || (5 < in_RDX[0x94])) {
                                                    *in_RDI = 
                                                  "kf_max_pyr_height out of range [-1..5]";
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  if ((in_RDX[0x94] != -1) &&
                                                     (in_RDX[0x94] < in_RDX[0x11])) {
                                                    *in_RDI = 
                                                  "The value of kf-max-pyr-height should not be smaller than gf-min-pyr-height"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  return AOM_CODEC_OK;
                                                  }
                                                  *in_RDI = 
                                                  "enable_reduced_reference_set out of range [0..1]"
                                                  ;
                                                  return AOM_CODEC_INVALID_PARAM;
                                                  }
                                                  }
                                                  *in_RDI = 
                                                  "cpu_used out of range [0..(cfg->g_usage == AOM_USAGE_REALTIME) ? 12 : 9]"
                                                  ;
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "enable_auto_bwd_ref out of range [..2]";
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "enable_auto_alt_ref out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = "ext_tile_debug out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "sb_multipass_unit_test out of range [..1]";
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "motion_vector_unit_test out of range [..2]";
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = "cdf_update_mode out of range [..2]";
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "rc_superres_mode out of range [..AOM_SUPERRES_AUTO]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "rc_resize_mode out of range [..RESIZE_MODES - 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = "gf_max_pyr_height out of range [..5]"
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = "gf_min_pyr_height out of range [..5]"
                                                    ;
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "max_gf_interval out of range [..MAX_LAG_BUFFERS - 1]"
                                                  ;
                                                  }
                                                  }
                                                  else {
                                                    *in_RDI = 
                                                  "min_gf_interval out of range [..MAX_LAG_BUFFERS - 1]"
                                                  ;
                                                  }
                                                }
                                                else {
                                                  *in_RDI = 
                                                  "g_lag_in_frames out of range [..MAX_LAG_BUFFERS]"
                                                  ;
                                                }
                                              }
                                              else {
                                                *in_RDI = 
                                                "g_pass out of range [AOM_RC_ONE_PASS..AOM_RC_THIRD_PASS]"
                                                ;
                                              }
                                            }
                                            else {
                                              *in_RDI = "rc_dropframe_thresh out of range [..100]";
                                            }
                                          }
                                          else {
                                            *in_RDI = 
                                            "kf_mode out of range [AOM_KF_DISABLED..AOM_KF_AUTO]";
                                          }
                                        }
                                        else {
                                          *in_RDI = "rc_2pass_vbr_bias_pct out of range [..100]";
                                        }
                                      }
                                      else {
                                        *in_RDI = "rc_overshoot_pct out of range [..100]";
                                      }
                                    }
                                    else {
                                      *in_RDI = "rc_undershoot_pct out of range [..100]";
                                    }
                                  }
                                  else {
                                    *in_RDI = "rc_end_usage out of range [AOM_VBR..AOM_Q]";
                                  }
                                }
                                else {
                                  *in_RDI = "g_threads out of range [..MAX_NUM_THREADS]";
                                }
                              }
                              else {
                                *in_RDI = "g_usage out of range [..AOM_USAGE_ALL_INTRA]";
                              }
                            }
                            else {
                              *in_RDI = "frame_periodic_boost out of range [..1]";
                            }
                          }
                          else {
                            *in_RDI = "deltalf_mode out of range [..1]";
                          }
                        }
                        else {
                          *in_RDI = 
                          "Variance Boost (deltaq_mode = 6) can only be set in all intra mode";
                        }
                      }
                      else {
                        *in_RDI = "deltaq_mode out of range [..DELTA_Q_MODE_COUNT - 1]";
                      }
                    }
                    else {
                      *in_RDI = "aq_mode out of range [..AQ_MODE_COUNT - 1]";
                    }
                  }
                  else {
                    *in_RDI = "lossless expected boolean";
                  }
                }
                else {
                  *in_RDI = "rc_max_quantizer out of range [..63]";
                }
              }
              else {
                *in_RDI = "rc_target_bitrate out of range [..2000000]";
              }
            }
            else {
              *in_RDI = "g_profile out of range [..MAX_PROFILES - 1]";
            }
          }
          else {
            *in_RDI = "max_frame_area out of range [..2^30]";
          }
        }
        else {
          *in_RDI = "g_h out of range [..cfg->g_forced_max_frame_height]";
        }
      }
      else {
        *in_RDI = "g_w out of range [..cfg->g_forced_max_frame_width]";
      }
    }
    else {
      *in_RDI = "g_forced_max_frame_height out of range [..65536]";
    }
  }
  else {
    *in_RDI = "g_forced_max_frame_width out of range [..65536]";
  }
  return AOM_CODEC_INVALID_PARAM;
}

Assistant:

static aom_codec_err_t validate_config(aom_codec_alg_priv_t *ctx,
                                       const aom_codec_enc_cfg_t *cfg,
                                       const struct av1_extracfg *extra_cfg) {
  RANGE_CHECK(cfg, g_w, 1, 65536);                        // 16 bits available
  RANGE_CHECK(cfg, g_h, 1, 65536);                        // 16 bits available
  RANGE_CHECK_HI(cfg, g_forced_max_frame_width, 65536);   // 16 bits available
  RANGE_CHECK_HI(cfg, g_forced_max_frame_height, 65536);  // 16 bits available
  if (cfg->g_forced_max_frame_width) {
    RANGE_CHECK_HI(cfg, g_w, cfg->g_forced_max_frame_width);
  }
  if (cfg->g_forced_max_frame_height) {
    RANGE_CHECK_HI(cfg, g_h, cfg->g_forced_max_frame_height);
  }
  // To avoid integer overflows when multiplying width by height (or values
  // derived from width and height) using the int type, impose a maximum frame
  // area (width * height) of 2^30.
  const unsigned int max_frame_width =
      cfg->g_forced_max_frame_width ? cfg->g_forced_max_frame_width : cfg->g_w;
  const unsigned int max_frame_height = cfg->g_forced_max_frame_height
                                            ? cfg->g_forced_max_frame_height
                                            : cfg->g_h;
  const int64_t max_frame_area = (int64_t)max_frame_width * max_frame_height;
  if (max_frame_area > (1 << 30)) {
    ERROR("max_frame_area out of range [..2^30]");
  }
  RANGE_CHECK(cfg, g_timebase.den, 1, 1000000000);
  RANGE_CHECK(cfg, g_timebase.num, 1, 1000000000);
  RANGE_CHECK_HI(cfg, g_profile, MAX_PROFILES - 1);

  RANGE_CHECK_HI(cfg, rc_target_bitrate, 2000000);
  RANGE_CHECK_HI(cfg, rc_max_quantizer, 63);
  RANGE_CHECK_HI(cfg, rc_min_quantizer, cfg->rc_max_quantizer);
  RANGE_CHECK_BOOL(extra_cfg, lossless);
  RANGE_CHECK_HI(extra_cfg, aq_mode, AQ_MODE_COUNT - 1);
  RANGE_CHECK_HI(extra_cfg, deltaq_mode, DELTA_Q_MODE_COUNT - 1);

  if (cfg->g_usage != ALLINTRA &&
      extra_cfg->deltaq_mode == DELTA_Q_VARIANCE_BOOST) {
    ERROR("Variance Boost (deltaq_mode = 6) can only be set in all intra mode");
  }

  RANGE_CHECK_HI(extra_cfg, deltalf_mode, 1);
  RANGE_CHECK_HI(extra_cfg, frame_periodic_boost, 1);
#if CONFIG_REALTIME_ONLY
  RANGE_CHECK(cfg, g_usage, AOM_USAGE_REALTIME, AOM_USAGE_REALTIME);
#else
  RANGE_CHECK_HI(cfg, g_usage, AOM_USAGE_ALL_INTRA);
#endif
  RANGE_CHECK_HI(cfg, g_threads, MAX_NUM_THREADS);
  RANGE_CHECK(cfg, rc_end_usage, AOM_VBR, AOM_Q);
  RANGE_CHECK_HI(cfg, rc_undershoot_pct, 100);
  RANGE_CHECK_HI(cfg, rc_overshoot_pct, 100);
  RANGE_CHECK_HI(cfg, rc_2pass_vbr_bias_pct, 100);
  RANGE_CHECK(cfg, kf_mode, AOM_KF_DISABLED, AOM_KF_AUTO);
  RANGE_CHECK_HI(cfg, rc_dropframe_thresh, 100);
  RANGE_CHECK(cfg, g_pass, AOM_RC_ONE_PASS, AOM_RC_THIRD_PASS);
  RANGE_CHECK_HI(cfg, g_lag_in_frames, MAX_LAG_BUFFERS);
  if (cfg->g_usage == AOM_USAGE_ALL_INTRA) {
    RANGE_CHECK_HI(cfg, g_lag_in_frames, 0);
    RANGE_CHECK_HI(cfg, kf_max_dist, 0);
  }
  RANGE_CHECK_HI(extra_cfg, min_gf_interval, MAX_LAG_BUFFERS - 1);
  RANGE_CHECK_HI(extra_cfg, max_gf_interval, MAX_LAG_BUFFERS - 1);
  if (extra_cfg->max_gf_interval > 0) {
    RANGE_CHECK(extra_cfg, max_gf_interval,
                AOMMAX(2, extra_cfg->min_gf_interval), (MAX_LAG_BUFFERS - 1));
  }
  RANGE_CHECK_HI(extra_cfg, gf_min_pyr_height, 5);
  RANGE_CHECK_HI(extra_cfg, gf_max_pyr_height, 5);
  if (extra_cfg->gf_min_pyr_height > extra_cfg->gf_max_pyr_height) {
    ERROR(
        "gf_min_pyr_height must be less than or equal to "
        "gf_max_pyramid_height");
  }

  RANGE_CHECK_HI(cfg, rc_resize_mode, RESIZE_MODES - 1);
  RANGE_CHECK(cfg, rc_resize_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK(cfg, rc_resize_kf_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK_HI(cfg, rc_superres_mode, AOM_SUPERRES_AUTO);
  RANGE_CHECK(cfg, rc_superres_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK(cfg, rc_superres_kf_denominator, SCALE_NUMERATOR,
              SCALE_NUMERATOR << 1);
  RANGE_CHECK(cfg, rc_superres_qthresh, 1, 63);
  RANGE_CHECK(cfg, rc_superres_kf_qthresh, 1, 63);
  RANGE_CHECK_HI(extra_cfg, cdf_update_mode, 2);

  RANGE_CHECK_HI(extra_cfg, motion_vector_unit_test, 2);
#if CONFIG_FPMT_TEST
  RANGE_CHECK_HI(extra_cfg, fpmt_unit_test, 1);
#endif
  RANGE_CHECK_HI(extra_cfg, sb_multipass_unit_test, 1);
  RANGE_CHECK_HI(extra_cfg, ext_tile_debug, 1);
  RANGE_CHECK_HI(extra_cfg, enable_auto_alt_ref, 1);
  RANGE_CHECK_HI(extra_cfg, enable_auto_bwd_ref, 2);
  RANGE_CHECK(extra_cfg, cpu_used, 0,
              (cfg->g_usage == AOM_USAGE_REALTIME) ? 12 : 9);
  RANGE_CHECK_HI(extra_cfg, noise_sensitivity, 6);
  RANGE_CHECK(extra_cfg, superblock_size, AOM_SUPERBLOCK_SIZE_64X64,
              AOM_SUPERBLOCK_SIZE_DYNAMIC);
  RANGE_CHECK_HI(cfg, large_scale_tile, 1);
  RANGE_CHECK_HI(extra_cfg, single_tile_decoding, 1);
  RANGE_CHECK_HI(extra_cfg, enable_rate_guide_deltaq, 1);

  RANGE_CHECK_HI(extra_cfg, row_mt, 1);
  RANGE_CHECK_HI(extra_cfg, fp_mt, 1);

  RANGE_CHECK_HI(extra_cfg, tile_columns, 6);
  RANGE_CHECK_HI(extra_cfg, tile_rows, 6);
  RANGE_CHECK_HI(extra_cfg, auto_tiles, 1);

  RANGE_CHECK_HI(cfg, monochrome, 1);

  if (cfg->large_scale_tile && extra_cfg->aq_mode)
    ERROR(
        "Adaptive quantization are not supported in large scale tile "
        "coding.");

  RANGE_CHECK_HI(extra_cfg, sharpness, 7);
  RANGE_CHECK_HI(extra_cfg, arnr_max_frames, 15);
  RANGE_CHECK_HI(extra_cfg, arnr_strength, 6);
  RANGE_CHECK_HI(extra_cfg, cq_level, 63);
  RANGE_CHECK(cfg, g_bit_depth, AOM_BITS_8, AOM_BITS_12);
  RANGE_CHECK(cfg, g_input_bit_depth, 8, 12);
  RANGE_CHECK(extra_cfg, content, AOM_CONTENT_DEFAULT, AOM_CONTENT_INVALID - 1);

  if (cfg->g_pass >= AOM_RC_SECOND_PASS) {
    const size_t packet_sz = sizeof(FIRSTPASS_STATS);
    const int n_packets = (int)(cfg->rc_twopass_stats_in.sz / packet_sz);
    const FIRSTPASS_STATS *stats;

    if (cfg->rc_twopass_stats_in.buf == NULL)
      ERROR("rc_twopass_stats_in.buf not set.");

    if (cfg->rc_twopass_stats_in.sz % packet_sz)
      ERROR("rc_twopass_stats_in.sz indicates truncated packet.");

    if (cfg->rc_twopass_stats_in.sz < 2 * packet_sz)
      ERROR("rc_twopass_stats_in requires at least two packets.");

    stats =
        (const FIRSTPASS_STATS *)cfg->rc_twopass_stats_in.buf + n_packets - 1;

    if ((int)(stats->count + 0.5) != n_packets - 1)
      ERROR("rc_twopass_stats_in missing EOS stats packet");
  }

  if (extra_cfg->passes != -1 && cfg->g_pass == AOM_RC_ONE_PASS &&
      extra_cfg->passes != 1) {
    ERROR("One pass encoding but passes != 1.");
  }

  if (extra_cfg->passes != -1 && (int)cfg->g_pass > extra_cfg->passes) {
    ERROR("Current pass is larger than total number of passes.");
  }

  if (cfg->g_profile == (unsigned int)PROFILE_1 && cfg->monochrome) {
    ERROR("Monochrome is not supported in profile 1");
  }

  if (cfg->g_profile <= (unsigned int)PROFILE_1 &&
      cfg->g_bit_depth > AOM_BITS_10) {
    ERROR("Codec bit-depth 12 not supported in profile < 2");
  }
  if (cfg->g_profile <= (unsigned int)PROFILE_1 &&
      cfg->g_input_bit_depth > 10) {
    ERROR("Source bit-depth 12 not supported in profile < 2");
  }

  if (cfg->rc_end_usage == AOM_Q) {
    RANGE_CHECK_HI(cfg, use_fixed_qp_offsets, 1);
  } else {
    if (cfg->use_fixed_qp_offsets > 0) {
      ERROR("--use_fixed_qp_offsets can only be used with --end-usage=q");
    }
  }

  RANGE_CHECK(extra_cfg, color_primaries, AOM_CICP_CP_BT_709,
              AOM_CICP_CP_EBU_3213);  // Need to check range more precisely to
                                      // check for reserved values?
  RANGE_CHECK(extra_cfg, transfer_characteristics, AOM_CICP_TC_BT_709,
              AOM_CICP_TC_HLG);
  RANGE_CHECK(extra_cfg, matrix_coefficients, AOM_CICP_MC_IDENTITY,
              AOM_CICP_MC_ICTCP);
  RANGE_CHECK(extra_cfg, color_range, 0, 1);

  /* Average corpus complexity is supported only in the case of single pass
   * VBR*/
  if (cfg->g_pass == AOM_RC_ONE_PASS && cfg->rc_end_usage == AOM_VBR)
    RANGE_CHECK_HI(extra_cfg, vbr_corpus_complexity_lap,
                   MAX_VBR_CORPUS_COMPLEXITY);
  else if (extra_cfg->vbr_corpus_complexity_lap != 0)
    ERROR(
        "VBR corpus complexity is supported only in the case of single pass "
        "VBR mode.");

#if !CONFIG_TUNE_BUTTERAUGLI
  if (extra_cfg->tuning == AOM_TUNE_BUTTERAUGLI) {
    ERROR(
        "This error may be related to the wrong configuration options: try to "
        "set -DCONFIG_TUNE_BUTTERAUGLI=1 at the time CMake is run.");
  }
#endif

#if !CONFIG_TUNE_VMAF
  if (extra_cfg->tuning >= AOM_TUNE_VMAF_WITH_PREPROCESSING &&
      extra_cfg->tuning <= AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    ERROR(
        "This error may be related to the wrong configuration options: try to "
        "set -DCONFIG_TUNE_VMAF=1 at the time CMake is run.");
  }
#endif

  RANGE_CHECK(extra_cfg, tuning, AOM_TUNE_PSNR, AOM_TUNE_SSIMULACRA2);

  RANGE_CHECK(extra_cfg, dist_metric, AOM_DIST_METRIC_PSNR,
              AOM_DIST_METRIC_QM_PSNR);

  RANGE_CHECK(extra_cfg, timing_info_type, AOM_TIMING_UNSPECIFIED,
              AOM_TIMING_DEC_MODEL);

  RANGE_CHECK(extra_cfg, film_grain_test_vector, 0, 16);

  if (extra_cfg->lossless) {
    if (extra_cfg->aq_mode != 0)
      ERROR("Only --aq_mode=0 can be used with --lossless=1.");
    if (extra_cfg->enable_chroma_deltaq)
      ERROR("Only --enable_chroma_deltaq=0 can be used with --lossless=1.");
  }

  RANGE_CHECK(extra_cfg, max_reference_frames, 3, 7);
  RANGE_CHECK(extra_cfg, enable_reduced_reference_set, 0, 1);

  RANGE_CHECK_HI(extra_cfg, enable_low_complexity_decode, 1);
  RANGE_CHECK_HI(extra_cfg, chroma_subsampling_x, 1);
  RANGE_CHECK_HI(extra_cfg, chroma_subsampling_y, 1);
  // 6.4.2 Color config semantics
  // If matrix_coefficients is equal to MC_IDENTITY, it is a requirement of
  // bitstream conformance that subsampling_x is equal to 0 and subsampling_y
  // is equal to 0.
  if (extra_cfg->matrix_coefficients == AOM_CICP_MC_IDENTITY &&
      (extra_cfg->chroma_subsampling_x != 0 ||
       extra_cfg->chroma_subsampling_y != 0)) {
    ERROR("Subsampling must be 0 with AOM_CICP_MC_IDENTITY.");
  }

  RANGE_CHECK_HI(extra_cfg, disable_trellis_quant, 3);
  RANGE_CHECK(extra_cfg, coeff_cost_upd_freq, 0, 3);
  RANGE_CHECK(extra_cfg, mode_cost_upd_freq, 0, 3);
  RANGE_CHECK(extra_cfg, mv_cost_upd_freq, 0, 3);
  RANGE_CHECK(extra_cfg, dv_cost_upd_freq, 0, 3);

  RANGE_CHECK(extra_cfg, min_partition_size, 4, 128);
  RANGE_CHECK(extra_cfg, max_partition_size, 4, 128);
  RANGE_CHECK_HI(extra_cfg, min_partition_size, extra_cfg->max_partition_size);

  for (int i = 0; i < MAX_NUM_OPERATING_POINTS; ++i) {
    const int level_idx = extra_cfg->target_seq_level_idx[i];
    if (!is_valid_seq_level_idx(level_idx) &&
        level_idx != SEQ_LEVEL_KEEP_STATS) {
      ERROR("Target sequence level index is invalid");
    }
  }

  RANGE_CHECK(extra_cfg, deltaq_strength, 0, 1000);
  RANGE_CHECK_HI(extra_cfg, loopfilter_control, 3);
  RANGE_CHECK_BOOL(extra_cfg, skip_postproc_filtering);
  RANGE_CHECK_HI(extra_cfg, enable_cdef, 3);
  RANGE_CHECK_BOOL(extra_cfg, auto_intra_tools_off);
  RANGE_CHECK_BOOL(extra_cfg, strict_level_conformance);
  RANGE_CHECK_BOOL(extra_cfg, sb_qp_sweep);

  RANGE_CHECK(extra_cfg, kf_max_pyr_height, -1, 5);
  if (extra_cfg->kf_max_pyr_height != -1 &&
      extra_cfg->kf_max_pyr_height < (int)extra_cfg->gf_min_pyr_height) {
    ERROR(
        "The value of kf-max-pyr-height should not be smaller than "
        "gf-min-pyr-height");
  }

  return AOM_CODEC_OK;
}